

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O1

void __thiscall
Noise::randomDirections
          (Noise *this,int number,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *RandomDirections)

{
  double *pdVar1;
  pointer pVVar2;
  time_t tVar3;
  long lVar4;
  Noise *this_00;
  value_type local_48;
  
  this_00 = (Noise *)(long)number;
  local_48.super_VectorDataT<double,_3>.values_[0] = 0.0;
  local_48.super_VectorDataT<double,_3>.values_[1] = 0.0;
  local_48.super_VectorDataT<double,_3>.values_[2] = 0.0;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (RandomDirections,(size_type)this_00,&local_48);
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  if (0 < number) {
    lVar4 = 0;
    do {
      generateRandomDirection(&local_48,this_00);
      pVVar2 = (RandomDirections->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(double *)((long)(pVVar2->super_VectorDataT<double,_3>).values_ + lVar4 + 0x10) =
           local_48.super_VectorDataT<double,_3>.values_[2];
      pdVar1 = (double *)((long)(pVVar2->super_VectorDataT<double,_3>).values_ + lVar4);
      *pdVar1 = local_48.super_VectorDataT<double,_3>.values_[0];
      pdVar1[1] = local_48.super_VectorDataT<double,_3>.values_[1];
      lVar4 = lVar4 + 0x18;
    } while ((ulong)(uint)number * 0x18 != lVar4);
  }
  return;
}

Assistant:

void Noise::randomDirections(int number, std::vector<TriMesh::Normal> &RandomDirections)
{
    RandomDirections.resize(number, TriMesh::Normal(0.0, 0.0, 0.0));

    srand((unsigned int)time(NULL));
    for(int i = 0; i < number; i++){
        RandomDirections[i] = generateRandomDirection();
    }
}